

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O0

void __thiscall
duckdb::BatchedBufferedData::BatchedBufferedData
          (BatchedBufferedData *this,weak_ptr<duckdb::ClientContext,_true> *context)

{
  element_type *peVar1;
  ulong uVar2;
  weak_ptr<duckdb::ClientContext,_true> *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  weak_ptr<duckdb::ClientContext,_true> *unaff_retaddr;
  Type in_stack_0000000c;
  BufferedData *in_stack_00000010;
  weak_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffffb8;
  weak_ptr<duckdb::ClientContext,_true> *__i;
  
  weak_ptr<duckdb::ClientContext,_true>::weak_ptr(in_RDI,in_stack_ffffffffffffffb8);
  BufferedData::BufferedData(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  weak_ptr<duckdb::ClientContext,_true>::~weak_ptr
            ((weak_ptr<duckdb::ClientContext,_true> *)0x1969a77);
  (in_RDI->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__BatchedBufferedData_03533ac0;
  __i = in_RDI + 5;
  ::std::
  map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
  ::map((map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
         *)0x1969a97);
  ::std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,(__integral_type)__i);
  ::std::
  deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ::deque((deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
           *)0x1969abd);
  ::std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,(__integral_type)__i);
  ::std::
  map<unsigned_long,_duckdb::InterruptState,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InterruptState>_>_>
  ::map((map<unsigned_long,_duckdb::InterruptState,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InterruptState>_>_>
         *)0x1969ae5);
  in_RDI[0x12].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  in_RDI[0x12].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = in_RDI[2].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar4._8_4_ = (int)((ulong)peVar1 >> 0x20);
  auVar4._0_8_ = peVar1;
  auVar4._12_4_ = 0x45300000;
  dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)peVar1) - 4503599627370496.0)) * 0.6;
  uVar2 = (ulong)dVar3;
  in_RDI[0xe].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f);
  peVar1 = in_RDI[2].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar5._8_4_ = (int)((ulong)peVar1 >> 0x20);
  auVar5._0_8_ = peVar1;
  auVar5._12_4_ = 0x45300000;
  dVar3 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)peVar1) - 4503599627370496.0)) * 0.4;
  uVar2 = (ulong)dVar3;
  in_RDI[8].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f);
  return;
}

Assistant:

BatchedBufferedData::BatchedBufferedData(weak_ptr<ClientContext> context)
    : BufferedData(BufferedData::Type::BATCHED, std::move(context)), buffer_byte_count(0), read_queue_byte_count(0),
      min_batch(0) {
	read_queue_capacity = (idx_t)(static_cast<double>(total_buffer_size) * 0.6);
	buffer_capacity = (idx_t)(static_cast<double>(total_buffer_size) * 0.4);
}